

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

void __thiscall Client::_parseLine(Client *this,string *line)

{
  char *pcVar1;
  ulong uVar2;
  type this_00;
  string local_b0 [32];
  string local_90 [55];
  allocator<char> local_59;
  undefined1 local_58 [8];
  string data;
  string command;
  string *line_local;
  Client *this_local;
  
  std::__cxx11::string::string((string *)(data.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_58,"",&local_59);
  std::allocator<char>::~allocator(&local_59);
  pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)line);
  if (*pcVar1 == '\\') {
    std::__cxx11::string::substr((ulong)local_90,(ulong)line);
    std::__cxx11::string::operator=((string *)(data.field_2._M_local_buf + 8),local_90);
    std::__cxx11::string::~string(local_90);
    uVar2 = std::__cxx11::string::length();
    if (5 < uVar2) {
      std::__cxx11::string::substr((ulong)local_b0,(ulong)line);
      std::__cxx11::string::operator=((string *)local_58,local_b0);
      std::__cxx11::string::~string(local_b0);
    }
  }
  else {
    std::__cxx11::string::operator=((string *)(data.field_2._M_local_buf + 8),"chat");
    std::__cxx11::string::operator=((string *)local_58,(string *)line);
  }
  this_00 = boost::shared_ptr<ServerConnection>::operator->(&this->m_server);
  ServerConnection::sendMessage(this_00,(string *)((long)&data.field_2 + 8),(string *)local_58);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(data.field_2._M_local_buf + 8));
  return;
}

Assistant:

void _parseLine( const string& line ){
        string command;
        string data = "";
        if( line[0] == '\\' ){
            command = line.substr( 1, 4 );
            if( line.length() > 5 ){
                data = line.substr( 6 );
            }
        }
        else {
            command = "chat";
            data = line;
        }
        m_server->sendMessage( command, data );
    }